

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  cmGlobalGenerator *pcVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar5;
  cmMakefile *this_01;
  reference value;
  ulong uVar6;
  bool local_153a;
  int local_1510;
  allocator local_1509;
  string local_1508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e8;
  int local_14c8;
  allocator local_14c1;
  string local_14c0;
  int local_14a0;
  allocator local_1499;
  string local_1498;
  allocator local_1471;
  string local_1470;
  undefined1 local_1450 [8];
  cmXMLWriter sesxml;
  cmGeneratedFileStream devses;
  string local_11b0;
  allocator local_1189;
  string local_1188;
  allocator local_1161;
  string local_1160;
  allocator local_1139;
  string local_1138;
  allocator local_1111;
  string local_1110;
  allocator local_10e9;
  string local_10e8;
  allocator local_10c1;
  string local_10c0;
  allocator local_1099;
  string local_1098;
  allocator local_1071;
  string local_1070;
  allocator local_1049;
  string local_1048;
  allocator local_1021;
  string local_1020;
  allocator local_ff9;
  string local_ff8;
  allocator local_fd1;
  string local_fd0;
  allocator local_fa9;
  string local_fa8;
  allocator local_f81;
  string local_f80;
  allocator local_f59;
  string local_f58;
  allocator local_f31;
  string local_f30;
  allocator local_f09;
  string local_f08;
  allocator local_ee1;
  string local_ee0;
  allocator local_eb9;
  string local_eb8;
  allocator local_e91;
  string local_e90;
  allocator local_e69;
  string local_e68;
  allocator local_e41;
  string local_e40;
  allocator local_e19;
  string local_e18;
  int local_df8;
  allocator local_df1;
  string local_df0;
  int local_dd0;
  allocator local_dc9;
  string local_dc8;
  int local_da8;
  allocator local_da1;
  string local_da0;
  allocator local_d79;
  string local_d78;
  allocator local_d51;
  string local_d50;
  allocator local_d29;
  string local_d28;
  allocator local_d01;
  string local_d00;
  allocator local_cd9;
  string local_cd8;
  allocator local_cb1;
  string local_cb0;
  allocator local_c89;
  string local_c88;
  allocator local_c61;
  string local_c60;
  allocator local_c39;
  string local_c38;
  allocator local_c11;
  string local_c10;
  allocator local_be9;
  string local_be8;
  allocator local_bc1;
  string local_bc0;
  allocator local_b99;
  string local_b98;
  allocator local_b71;
  string local_b70;
  allocator local_b49;
  string local_b48;
  allocator local_b21;
  string local_b20;
  allocator local_af9;
  string local_af8;
  allocator local_ad1;
  string local_ad0;
  allocator local_aa9;
  string local_aa8;
  allocator local_a81;
  string local_a80;
  allocator local_a59;
  string local_a58;
  allocator local_a31;
  string local_a30;
  allocator local_a09;
  string local_a08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9d8;
  const_iterator dirIt;
  string local_9c8;
  int local_9a8;
  allocator local_9a1;
  string local_9a0;
  int local_980;
  allocator local_979;
  string local_978;
  allocator local_951;
  string local_950;
  allocator local_929;
  string local_928;
  allocator local_901;
  string local_900;
  allocator local_8d9;
  string local_8d8;
  char *local_8b8;
  allocator local_8a9;
  string local_8a8;
  allocator local_881;
  string local_880;
  int local_860;
  allocator local_859;
  string local_858;
  allocator local_831;
  string local_830;
  allocator local_809;
  string local_808;
  allocator local_7e1;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  allocator local_791;
  string local_790;
  allocator local_769;
  string local_768;
  allocator local_741;
  string local_740;
  allocator local_719;
  string local_718;
  allocator local_6f1;
  string local_6f0;
  allocator local_6c9;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  allocator local_589;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  undefined1 local_3d0 [8];
  string primaryLanguage;
  string local_3a8;
  byte local_384;
  byte local_383;
  byte local_382;
  allocator local_381;
  undefined1 local_380 [4];
  bool enableFortran;
  allocator local_359;
  string local_358;
  byte local_331;
  undefined1 local_330 [7];
  bool enableCxx;
  byte local_309;
  undefined1 local_308 [7];
  bool hasCvs;
  byte local_2e1;
  undefined1 local_2e0 [7];
  bool hasSvn;
  cmXMLWriter xml;
  undefined1 local_280 [8];
  cmGeneratedFileStream fout;
  string *cmakeFilePattern_local;
  string *executable_local;
  string *filename_local;
  string *projectDir_local;
  string *outputDir_local;
  cmGlobalKdevelopGenerator *this_local;
  
  fout._576_8_ = cmakeFilePattern;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,pcVar4,false,None)
  ;
  bVar2 = std::ios::operator!((ios *)(local_280 + (long)*(_func_int **)((long)local_280 + -0x18)));
  if ((bVar2 & 1) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2e0,(ostream *)local_280,0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   projectDir,"/.svn");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmsys::SystemTools::FileExists(pcVar4);
    std::__cxx11::string::~string((string *)local_308);
    local_2e1 = bVar3;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   projectDir,"/CVS");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmsys::SystemTools::FileExists(pcVar4);
    std::__cxx11::string::~string((string *)local_330);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_309 = bVar3;
    std::allocator<char>::allocator();
    local_382 = 0;
    local_383 = 0;
    std::__cxx11::string::string((string *)&local_358,"C",&local_359);
    bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_358);
    local_153a = true;
    if (!bVar3) {
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::allocator<char>::allocator();
      local_382 = 1;
      std::__cxx11::string::string((string *)local_380,"CXX",&local_381);
      local_383 = 1;
      local_153a = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)local_380);
    }
    if ((local_383 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_380);
    }
    if ((local_382 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
    }
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    local_331 = local_153a;
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3a8,"Fortran",
               (allocator *)(primaryLanguage.field_2._M_local_buf + 0xf));
    bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(primaryLanguage.field_2._M_local_buf + 0xf));
    local_384 = bVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_3d0,"C++",&local_3d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    if (((local_384 & 1) != 0) && ((local_331 & 1) == 0)) {
      std::__cxx11::string::operator=((string *)local_3d0,"Fortran77");
    }
    cmXMLWriter::StartDocument((cmXMLWriter *)local_2e0,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"kdevelop",&local_3f9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"general",&local_421);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_448,"author",&local_449);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_2e0,&local_448,(char (*) [1])0xb17e7c);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_470,"email",&local_471);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_2e0,&local_470,(char (*) [1])0xb17e7c);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_498,"version",&local_499);
    cmXMLWriter::Element<char[10]>((cmXMLWriter *)local_2e0,&local_498,(char (*) [10])"$VERSION$");
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator((allocator<char> *)&local_499);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c0,"projectmanagement",&local_4c1);
    cmXMLWriter::Element<char[18]>
              ((cmXMLWriter *)local_2e0,&local_4c0,(char (*) [18])"KDevCustomProject");
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e8,"primarylanguage",&local_4e9);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_4e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"ignoreparts");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_510,"projectdirectory",&local_511);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_510,projectDir);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"absoluteprojectpath",&local_539);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_538,(char (*) [5])0xaf7cf3);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_560,"secondaryLanguages",&local_561);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    if (((local_384 & 1) != 0) && ((local_331 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_588,"language",&local_589);
      cmXMLWriter::Element<char[8]>((cmXMLWriter *)local_2e0,&local_588,(char (*) [8])0xb07b7f);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator((allocator<char> *)&local_589);
    }
    if ((local_331 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5b0,"language",&local_5b1);
      cmXMLWriter::Element<char[2]>((cmXMLWriter *)local_2e0,&local_5b0,(char (*) [2])0xad618f);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((local_2e1 & 1) == 0) {
      if ((local_309 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_600,"versioncontrol",&local_601);
        cmXMLWriter::Element<char[15]>
                  ((cmXMLWriter *)local_2e0,&local_600,(char (*) [15])"kdevcvsservice");
        std::__cxx11::string::~string((string *)&local_600);
        std::allocator<char>::~allocator((allocator<char> *)&local_601);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5d8,"versioncontrol",&local_5d9);
      cmXMLWriter::Element<char[15]>
                ((cmXMLWriter *)local_2e0,&local_5d8,(char (*) [15])"kdevsubversion");
      std::__cxx11::string::~string((string *)&local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_628,"kdevcustomproject",&local_629);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator((allocator<char> *)&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_650,"filelistdirectory",&local_651);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_650,outputDir);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_678,"run",&local_679);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_678);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator((allocator<char> *)&local_679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6a0,"mainprogram",&local_6a1);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_6a0,executable);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6c8,"directoryradio",&local_6c9);
    cmXMLWriter::Element<char[7]>((cmXMLWriter *)local_2e0,&local_6c8,(char (*) [7])0xafd1bc);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6f0,"customdirectory",&local_6f1);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_6f0,outputDir);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_718,"programargs",&local_719);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_2e0,&local_718,(char (*) [1])0xb17e7c);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator((allocator<char> *)&local_719);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_740,"terminal",&local_741);
    cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_740,(char (*) [6])0xb093ed);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator((allocator<char> *)&local_741);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_768,"autocompile",&local_769);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_768,(char (*) [5])0xaf7cf3);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator((allocator<char> *)&local_769);
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"envvars");
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_790,"build",&local_791);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator((allocator<char> *)&local_791);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b8,"buildtool",&local_7b9);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_7b8,(char (*) [5])0xb011f0);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7e0,"builddir",&local_7e1);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_7e0,outputDir);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_808,"make",&local_809);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator((allocator<char> *)&local_809);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_830,"abortonerror",&local_831);
    cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_830,(char (*) [6])0xb093ed);
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator((allocator<char> *)&local_831);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_858,"numberofjobs",&local_859);
    local_860 = 1;
    cmXMLWriter::Element<int>((cmXMLWriter *)local_2e0,&local_858,&local_860);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_880,"dontact",&local_881);
    cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_880,(char (*) [6])0xb093ed);
    std::__cxx11::string::~string((string *)&local_880);
    std::allocator<char>::~allocator((allocator<char> *)&local_881);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8a8,"makebin",&local_8a9);
    this_00 = cmGlobalGenerator::GetLocalGenerators
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,0);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8d8,"CMAKE_MAKE_PROGRAM",&local_8d9);
    local_8b8 = cmMakefile::GetRequiredDefinition(this_01,&local_8d8);
    cmXMLWriter::Element<char_const*>((cmXMLWriter *)local_2e0,&local_8a8,&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_900,"selectedenvironment",&local_901);
    cmXMLWriter::Element<char[8]>((cmXMLWriter *)local_2e0,&local_900,(char (*) [8])0xb2e13b);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_928,"environments",&local_929);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_928);
    std::__cxx11::string::~string((string *)&local_928);
    std::allocator<char>::~allocator((allocator<char> *)&local_929);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_950,"default",&local_951);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::allocator<char>::~allocator((allocator<char> *)&local_951);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_978,"envvar",&local_979);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_978);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator((allocator<char> *)&local_979);
    local_980 = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_2e0,"value",&local_980);
    cmXMLWriter::Attribute<char[8]>((cmXMLWriter *)local_2e0,"name",(char (*) [8])0xae99d4);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9a0,"envvar",&local_9a1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_9a0);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
    local_9a8 = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_2e0,"value",&local_9a8);
    cmXMLWriter::Attribute<char[17]>
              ((cmXMLWriter *)local_2e0,"name",(char (*) [17])"CMAKE_NO_VERBOSE");
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_9c8,"blacklist",(allocator *)((long)&dirIt._M_current + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_9c8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirIt._M_current + 7));
    local_9e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Blacklist);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_9d8,&local_9e0);
    while( true ) {
      local_9e8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Blacklist);
      bVar3 = __gnu_cxx::operator!=(&local_9d8,&local_9e8);
      if (!bVar3) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a08,"path",&local_a09);
      value = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_9d8);
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_a08,value);
      std::__cxx11::string::~string((string *)&local_a08);
      std::allocator<char>::~allocator((allocator<char> *)&local_a09);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_9d8);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a30,"kdevfilecreate",&local_a31);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"filetypes");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a58,"useglobaltypes",&local_a59);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator((allocator<char> *)&local_a59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a80,"type",&local_a81);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_a80);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator((allocator<char> *)&local_a81);
    cmXMLWriter::Attribute<char[3]>((cmXMLWriter *)local_2e0,"ext",(char (*) [3])0xaf5f51);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_aa8,"type",&local_aa9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_aa8);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
    cmXMLWriter::Attribute<char[4]>((cmXMLWriter *)local_2e0,"ext",(char (*) [4])0xb3adb5);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ad0,"type",&local_ad1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
    cmXMLWriter::Attribute<char[2]>((cmXMLWriter *)local_2e0,"ext",(char (*) [2])0xadb0e4);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_af8,"kdevdoctreeview",&local_af9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_af8);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator((allocator<char> *)&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b20,"projectdoc",&local_b21);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator((allocator<char> *)&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b48,"userdocDir",&local_b49);
    cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_b48,(char (*) [6])"html/");
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b70,"apidocDir",&local_b71);
    cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_b70,(char (*) [6])"html/");
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator((allocator<char> *)&local_b71);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"ignoreqt_xml");
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"ignoredoxygen");
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"ignorekdocs");
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"ignoretocs");
    cmXMLWriter::Element((cmXMLWriter *)local_2e0,"ignoredevhelp");
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((local_331 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b98,"cppsupportpart",&local_b99);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_b98);
      std::__cxx11::string::~string((string *)&local_b98);
      std::allocator<char>::~allocator((allocator<char> *)&local_b99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_bc0,"filetemplates",&local_bc1);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_bc0);
      std::__cxx11::string::~string((string *)&local_bc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_be8,"interfacesuffix",&local_be9);
      cmXMLWriter::Element<char[3]>((cmXMLWriter *)local_2e0,&local_be8,(char (*) [3])0xae5345);
      std::__cxx11::string::~string((string *)&local_be8);
      std::allocator<char>::~allocator((allocator<char> *)&local_be9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c10,"implementationsuffix",&local_c11);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_c10,(char (*) [5])0xb3adb4);
      std::__cxx11::string::~string((string *)&local_c10);
      std::allocator<char>::~allocator((allocator<char> *)&local_c11);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c38,"kdevcppsupport",&local_c39);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_c38);
      std::__cxx11::string::~string((string *)&local_c38);
      std::allocator<char>::~allocator((allocator<char> *)&local_c39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c60,"codecompletion",&local_c61);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_c60);
      std::__cxx11::string::~string((string *)&local_c60);
      std::allocator<char>::~allocator((allocator<char> *)&local_c61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c88,"includeGlobalFunctions",&local_c89);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_c88,(char (*) [5])0xaf7cf3);
      std::__cxx11::string::~string((string *)&local_c88);
      std::allocator<char>::~allocator((allocator<char> *)&local_c89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_cb0,"includeTypes",&local_cb1);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_cb0,(char (*) [5])0xaf7cf3);
      std::__cxx11::string::~string((string *)&local_cb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_cd8,"includeEnums",&local_cd9);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_cd8,(char (*) [5])0xaf7cf3);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d00,"includeTypedefs",&local_d01);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_d00,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_d00);
      std::allocator<char>::~allocator((allocator<char> *)&local_d01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d28,"automaticCodeCompletion",&local_d29);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_d28,(char (*) [5])0xaf7cf3);
      std::__cxx11::string::~string((string *)&local_d28);
      std::allocator<char>::~allocator((allocator<char> *)&local_d29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d50,"automaticArgumentsHint",&local_d51);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_d50,(char (*) [5])0xaf7cf3);
      std::__cxx11::string::~string((string *)&local_d50);
      std::allocator<char>::~allocator((allocator<char> *)&local_d51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d78,"automaticHeaderCompletion",&local_d79);
      cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_d78,(char (*) [5])0xaf7cf3);
      std::__cxx11::string::~string((string *)&local_d78);
      std::allocator<char>::~allocator((allocator<char> *)&local_d79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_da0,"codeCompletionDelay",&local_da1);
      local_da8 = 0xfa;
      cmXMLWriter::Element<int>((cmXMLWriter *)local_2e0,&local_da0,&local_da8);
      std::__cxx11::string::~string((string *)&local_da0);
      std::allocator<char>::~allocator((allocator<char> *)&local_da1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_dc8,"argumentsHintDelay",&local_dc9);
      local_dd0 = 400;
      cmXMLWriter::Element<int>((cmXMLWriter *)local_2e0,&local_dc8,&local_dd0);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_df0,"headerCompletionDelay",&local_df1);
      local_df8 = 0xfa;
      cmXMLWriter::Element<int>((cmXMLWriter *)local_2e0,&local_df0,&local_df8);
      std::__cxx11::string::~string((string *)&local_df0);
      std::allocator<char>::~allocator((allocator<char> *)&local_df1);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"references");
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    }
    if ((local_384 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e18,"kdevfortransupport",&local_e19);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_e18);
      std::__cxx11::string::~string((string *)&local_e18);
      std::allocator<char>::~allocator((allocator<char> *)&local_e19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e40,"ftnchek",&local_e41);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_e40);
      std::__cxx11::string::~string((string *)&local_e40);
      std::allocator<char>::~allocator((allocator<char> *)&local_e41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e68,"division",&local_e69);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_e68,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_e68);
      std::allocator<char>::~allocator((allocator<char> *)&local_e69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e90,"extern",&local_e91);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_e90,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_e90);
      std::allocator<char>::~allocator((allocator<char> *)&local_e91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_eb8,"declare",&local_eb9);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_eb8,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ee0,"pure",&local_ee1);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_ee0,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_ee0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f08,"argumentsall",&local_f09);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_f08,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_f08);
      std::allocator<char>::~allocator((allocator<char> *)&local_f09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f30,"commonall",&local_f31);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_f30,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_f30);
      std::allocator<char>::~allocator((allocator<char> *)&local_f31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f58,"truncationall",&local_f59);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_f58,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_f58);
      std::allocator<char>::~allocator((allocator<char> *)&local_f59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f80,"usageall",&local_f81);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_f80,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_f80);
      std::allocator<char>::~allocator((allocator<char> *)&local_f81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_fa8,"f77all",&local_fa9);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_fa8,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_fa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_fd0,"portabilityall",&local_fd1);
      cmXMLWriter::Element<char[6]>((cmXMLWriter *)local_2e0,&local_fd0,(char (*) [6])0xb093ed);
      std::__cxx11::string::~string((string *)&local_fd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"argumentsonly");
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"commononly");
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"truncationonly");
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"usageonly");
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"f77only");
      cmXMLWriter::Element((cmXMLWriter *)local_2e0,"portabilityonly");
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ff8,"kdevfileview",&local_ff9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_ff8);
    std::__cxx11::string::~string((string *)&local_ff8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1020,"groups",&local_1021);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_1020);
    std::__cxx11::string::~string((string *)&local_1020);
    std::allocator<char>::~allocator((allocator<char> *)&local_1021);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1048,"group",&local_1049);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_1048);
    std::__cxx11::string::~string((string *)&local_1048);
    std::allocator<char>::~allocator((allocator<char> *)&local_1049);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,"pattern",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fout._576_8_);
    cmXMLWriter::Attribute<char[6]>((cmXMLWriter *)local_2e0,"name",(char (*) [6])0xadc300);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((local_331 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1070,"group",&local_1071);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_1070);
      std::__cxx11::string::~string((string *)&local_1070);
      std::allocator<char>::~allocator((allocator<char> *)&local_1071);
      cmXMLWriter::Attribute<char[16]>
                ((cmXMLWriter *)local_2e0,"pattern",(char (*) [16])"*.h;*.hxx;*.hpp");
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_2e0,"name",(char (*) [7])0xafd671);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1098,"group",&local_1099);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_1098);
      std::__cxx11::string::~string((string *)&local_1098);
      std::allocator<char>::~allocator((allocator<char> *)&local_1099);
      cmXMLWriter::Attribute<char[4]>((cmXMLWriter *)local_2e0,"pattern",(char (*) [4])"*.c");
      cmXMLWriter::Attribute<char[10]>((cmXMLWriter *)local_2e0,"name",(char (*) [10])"C Sources");
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10c0,"group",&local_10c1);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_10c0);
      std::__cxx11::string::~string((string *)&local_10c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
      cmXMLWriter::Attribute<char[21]>
                ((cmXMLWriter *)local_2e0,"pattern",(char (*) [21])"*.cpp;*.C;*.cxx;*.cc");
      cmXMLWriter::Attribute<char[12]>((cmXMLWriter *)local_2e0,"name",(char (*) [12])"C++ Sources")
      ;
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    }
    if ((local_384 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10e8,"group",&local_10e9);
      cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_10e8);
      std::__cxx11::string::~string((string *)&local_10e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
      cmXMLWriter::Attribute<char[50]>
                ((cmXMLWriter *)local_2e0,"pattern",
                 (char (*) [50])"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
      cmXMLWriter::Attribute<char[16]>
                ((cmXMLWriter *)local_2e0,"name",(char (*) [16])"Fortran Sources");
      cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1110,"group",&local_1111);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_1110);
    std::__cxx11::string::~string((string *)&local_1110);
    std::allocator<char>::~allocator((allocator<char> *)&local_1111);
    cmXMLWriter::Attribute<char[5]>((cmXMLWriter *)local_2e0,"pattern",(char (*) [5])"*.ui");
    cmXMLWriter::Attribute<char[18]>
              ((cmXMLWriter *)local_2e0,"name",(char (*) [18])"Qt Designer files");
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1138,"hidenonprojectfiles",&local_1139);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_1138,(char (*) [5])0xaf7cf3);
    std::__cxx11::string::~string((string *)&local_1138);
    std::allocator<char>::~allocator((allocator<char> *)&local_1139);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1160,"tree",&local_1161);
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_1160);
    std::__cxx11::string::~string((string *)&local_1160);
    std::allocator<char>::~allocator((allocator<char> *)&local_1161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1188,"hidepatterns",&local_1189);
    cmXMLWriter::Element<char[23]>
              ((cmXMLWriter *)local_2e0,&local_1188,(char (*) [23])"*.o,*.lo,CVS,*~,cmake*");
    std::__cxx11::string::~string((string *)&local_1188);
    std::allocator<char>::~allocator((allocator<char> *)&local_1189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_11b0,"hidenonprojectfiles",(allocator *)&devses.field_0x247);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_11b0,(char (*) [5])0xaf7cf3);
    std::__cxx11::string::~string((string *)&local_11b0);
    std::allocator<char>::~allocator((allocator<char> *)&devses.field_0x247);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_2e0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&sesxml.ElementOpen,pcVar4,false,None);
      bVar2 = std::ios::operator!((ios *)(&sesxml.ElementOpen + *(long *)(sesxml._72_8_ + -0x18)));
      xml.ElementOpen = (bVar2 & 1) != 0;
      if (!xml.ElementOpen) {
        cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_1450,(ostream *)&sesxml.ElementOpen,0);
        cmXMLWriter::StartDocument((cmXMLWriter *)local_1450,"UTF-8");
        cmXMLWriter::Doctype((cmXMLWriter *)local_1450,"KDevPrjSession");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1470,"KDevPrjSession",&local_1471);
        cmXMLWriter::StartElement((cmXMLWriter *)local_1450,&local_1470);
        std::__cxx11::string::~string((string *)&local_1470);
        std::allocator<char>::~allocator((allocator<char> *)&local_1471);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1498,"DocsAndViews",&local_1499);
        cmXMLWriter::StartElement((cmXMLWriter *)local_1450,&local_1498);
        std::__cxx11::string::~string((string *)&local_1498);
        std::allocator<char>::~allocator((allocator<char> *)&local_1499);
        local_14a0 = 1;
        cmXMLWriter::Attribute<int>((cmXMLWriter *)local_1450,"NumberOfDocuments",&local_14a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_14c0,"Doc0",&local_14c1);
        cmXMLWriter::StartElement((cmXMLWriter *)local_1450,&local_14c0);
        std::__cxx11::string::~string((string *)&local_14c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_14c1);
        local_14c8 = 1;
        cmXMLWriter::Attribute<int>((cmXMLWriter *)local_1450,"NumberOfViews",&local_14c8);
        std::operator+(&local_14e8,"file://",fileToOpen);
        cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_1450,"URL",&local_14e8);
        std::__cxx11::string::~string((string *)&local_14e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1508,"View0",&local_1509);
        cmXMLWriter::StartElement((cmXMLWriter *)local_1450,&local_1508);
        std::__cxx11::string::~string((string *)&local_1508);
        std::allocator<char>::~allocator((allocator<char> *)&local_1509);
        local_1510 = 0;
        cmXMLWriter::Attribute<int>((cmXMLWriter *)local_1450,"line",&local_1510);
        cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_1450,"Type",(char (*) [7])0xafefe3);
        cmXMLWriter::EndElement((cmXMLWriter *)local_1450);
        cmXMLWriter::EndElement((cmXMLWriter *)local_1450);
        cmXMLWriter::EndElement((cmXMLWriter *)local_1450);
        cmXMLWriter::EndElement((cmXMLWriter *)local_1450);
        cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_1450);
      }
      xml.BreakAttrib = false;
      xml.IsContent = false;
      xml._75_1_ = 0;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&sesxml.ElementOpen);
    }
    else {
      xml.ElementOpen = true;
      xml.BreakAttrib = false;
      xml.IsContent = false;
      xml._75_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_3d0);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2e0);
  }
  else {
    xml.ElementOpen = true;
    xml.BreakAttrib = false;
    xml.IsContent = false;
    xml._75_1_ = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::CreateNewProjectFile(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& filename, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen,
  const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C") ||
                    this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx) {
    primaryLanguage = "Fortran77";
  }

  xml.StartDocument();
  xml.StartElement("kdevelop");
  xml.StartElement("general");

  xml.Element("author", "");
  xml.Element("email", "");
  xml.Element("version", "$VERSION$");
  xml.Element("projectmanagement", "KDevCustomProject");
  xml.Element("primarylanguage", primaryLanguage);
  xml.Element("ignoreparts");
  xml.Element("projectdirectory", projectDir); // this one is important
  xml.Element("absoluteprojectpath", "true");  // and this one

  // setup additional languages
  xml.StartElement("secondaryLanguages");
  if (enableFortran && enableCxx) {
    xml.Element("language", "Fortran");
  }
  if (enableCxx) {
    xml.Element("language", "C");
  }
  xml.EndElement();

  if (hasSvn) {
    xml.Element("versioncontrol", "kdevsubversion");
  } else if (hasCvs) {
    xml.Element("versioncontrol", "kdevcvsservice");
  }

  xml.EndElement(); // general
  xml.StartElement("kdevcustomproject");

  xml.Element("filelistdirectory", outputDir);

  xml.StartElement("run");
  xml.Element("mainprogram", executable);
  xml.Element("directoryradio", "custom");
  xml.Element("customdirectory", outputDir);
  xml.Element("programargs", "");
  xml.Element("terminal", "false");
  xml.Element("autocompile", "true");
  xml.Element("envvars");
  xml.EndElement();

  xml.StartElement("build");
  xml.Element("buildtool", "make");   // this one is important
  xml.Element("builddir", outputDir); // and this one
  xml.EndElement();

  xml.StartElement("make");
  xml.Element("abortonerror", "false");
  xml.Element("numberofjobs", 1);
  xml.Element("dontact", "false");
  xml.Element("makebin", this->GlobalGenerator->GetLocalGenerators()[0]
                           ->GetMakefile()
                           ->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"));
  xml.Element("selectedenvironment", "default");

  xml.StartElement("environments");
  xml.StartElement("default");

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "VERBOSE");
  xml.EndElement();

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "CMAKE_NO_VERBOSE");
  xml.EndElement();

  xml.EndElement(); // default
  xml.EndElement(); // environments
  xml.EndElement(); // make

  xml.StartElement("blacklist");
  for (std::vector<std::string>::const_iterator dirIt =
         this->Blacklist.begin();
       dirIt != this->Blacklist.end(); ++dirIt) {
    xml.Element("path", *dirIt);
  }
  xml.EndElement();

  xml.EndElement(); // kdevcustomproject

  xml.StartElement("kdevfilecreate");
  xml.Element("filetypes");
  xml.StartElement("useglobaltypes");

  xml.StartElement("type");
  xml.Attribute("ext", "ui");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "cpp");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "h");
  xml.EndElement();

  xml.EndElement(); // useglobaltypes
  xml.EndElement(); // kdevfilecreate

  xml.StartElement("kdevdoctreeview");
  xml.StartElement("projectdoc");
  xml.Element("userdocDir", "html/");
  xml.Element("apidocDir", "html/");
  xml.EndElement(); // projectdoc
  xml.Element("ignoreqt_xml");
  xml.Element("ignoredoxygen");
  xml.Element("ignorekdocs");
  xml.Element("ignoretocs");
  xml.Element("ignoredevhelp");
  xml.EndElement(); // kdevdoctreeview;

  if (enableCxx) {
    xml.StartElement("cppsupportpart");
    xml.StartElement("filetemplates");
    xml.Element("interfacesuffix", ".h");
    xml.Element("implementationsuffix", ".cpp");
    xml.EndElement(); // filetemplates
    xml.EndElement(); // cppsupportpart

    xml.StartElement("kdevcppsupport");
    xml.StartElement("codecompletion");
    xml.Element("includeGlobalFunctions", "true");
    xml.Element("includeTypes", "true");
    xml.Element("includeEnums", "true");
    xml.Element("includeTypedefs", "false");
    xml.Element("automaticCodeCompletion", "true");
    xml.Element("automaticArgumentsHint", "true");
    xml.Element("automaticHeaderCompletion", "true");
    xml.Element("codeCompletionDelay", 250);
    xml.Element("argumentsHintDelay", 400);
    xml.Element("headerCompletionDelay", 250);
    xml.EndElement(); // codecompletion
    xml.Element("references");
    xml.EndElement(); // kdevcppsupport;
  }

  if (enableFortran) {
    xml.StartElement("kdevfortransupport");
    xml.StartElement("ftnchek");
    xml.Element("division", "false");
    xml.Element("extern", "false");
    xml.Element("declare", "false");
    xml.Element("pure", "false");
    xml.Element("argumentsall", "false");
    xml.Element("commonall", "false");
    xml.Element("truncationall", "false");
    xml.Element("usageall", "false");
    xml.Element("f77all", "false");
    xml.Element("portabilityall", "false");
    xml.Element("argumentsonly");
    xml.Element("commononly");
    xml.Element("truncationonly");
    xml.Element("usageonly");
    xml.Element("f77only");
    xml.Element("portabilityonly");
    xml.EndElement(); // ftnchek
    xml.EndElement(); // kdevfortransupport;
  }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  xml.StartElement("kdevfileview");
  xml.StartElement("groups");

  xml.StartElement("group");
  xml.Attribute("pattern", cmakeFilePattern);
  xml.Attribute("name", "CMake");
  xml.EndElement();

  if (enableCxx) {
    xml.StartElement("group");
    xml.Attribute("pattern", "*.h;*.hxx;*.hpp");
    xml.Attribute("name", "Header");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.c");
    xml.Attribute("name", "C Sources");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.cpp;*.C;*.cxx;*.cc");
    xml.Attribute("name", "C++ Sources");
    xml.EndElement();
  }

  if (enableFortran) {
    xml.StartElement("group");
    xml.Attribute("pattern",
                  "*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    xml.Attribute("name", "Fortran Sources");
    xml.EndElement();
  }

  xml.StartElement("group");
  xml.Attribute("pattern", "*.ui");
  xml.Attribute("name", "Qt Designer files");
  xml.EndElement();

  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // groups

  xml.StartElement("tree");
  xml.Element("hidepatterns", "*.o,*.lo,CVS,*~,cmake*");
  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // tree

  xml.EndElement(); // kdevfileview
  xml.EndElement(); // kdevelop;
  xml.EndDocument();

  if (sessionFilename.empty()) {
    return;
  }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if (!devses) {
    return;
  }
  cmXMLWriter sesxml(devses);
  sesxml.StartDocument("UTF-8");
  sesxml.Doctype("KDevPrjSession");
  sesxml.StartElement("KDevPrjSession");

  sesxml.StartElement("DocsAndViews");
  sesxml.Attribute("NumberOfDocuments", 1);

  sesxml.StartElement("Doc0");
  sesxml.Attribute("NumberOfViews", 1);
  sesxml.Attribute("URL", "file://" + fileToOpen);

  sesxml.StartElement("View0");
  sesxml.Attribute("line", 0);
  sesxml.Attribute("Type", "Source");
  sesxml.EndElement(); // View0

  sesxml.EndElement(); // Doc0
  sesxml.EndElement(); // DocsAndViews
  sesxml.EndElement(); // KDevPrjSession;
}